

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e304c3::AV1Convolve2DHighbdCompoundTest::Convolve
          (AV1Convolve2DHighbdCompoundTest *this,highbd_convolve_2d_func test_func,uint16_t *src1,
          uint16_t *src2,uint16_t *dst,uint16_t *conv_buf,CompoundParam *compound,InterpFilter h_f,
          InterpFilter v_f,int sub_x,int sub_y)

{
  ParamType *pPVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  code *in_RSI;
  undefined8 in_R8;
  InterpFilter in_stack_00000010;
  InterpFilter in_stack_00000018;
  undefined4 in_stack_00000020;
  int in_stack_00000028;
  ConvolveParams conv_params;
  int bit_depth;
  InterpFilterParams *filter_params_y;
  InterpFilterParams *filter_params_x;
  int height;
  int width;
  BlockSize *block;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int bit_depth_00;
  int in_stack_ffffffffffffff14;
  CONV_BUF_TYPE *in_stack_ffffffffffffff18;
  CONV_BUF_TYPE *conv_buf_00;
  int in_stack_ffffffffffffff24;
  undefined1 local_d8 [48];
  CONV_BUF_TYPE local_a8 [26];
  int local_74;
  InterpFilterParams *local_70;
  InterpFilterParams *local_68;
  int local_60;
  int local_5c;
  BlockSize *local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  code *local_30;
  
  local_48 = in_R8;
  local_40 = in_RCX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  pPVar1 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>_>
           ::GetParam();
  local_58 = TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
             ::Block(pPVar1);
  local_5c = BlockSize::Width(local_58);
  local_60 = BlockSize::Height(local_58);
  local_68 = av1_get_interp_filter_params_with_block_size(in_stack_00000010,local_5c);
  local_70 = av1_get_interp_filter_params_with_block_size(in_stack_00000018,local_60);
  pPVar1 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>_>
           ::GetParam();
  local_74 = TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
             ::BitDepth(pPVar1);
  GetConvolveParams(in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                    in_stack_ffffffffffffff10,
                    (CompoundParam *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  conv_buf_00 = local_a8;
  uVar2 = in_stack_00000020;
  bit_depth_00 = in_stack_00000028;
  (*local_30)(local_38,local_5c,local_48,0x80,local_5c,local_60,local_68,local_70);
  GetConvolveParams(in_stack_ffffffffffffff24,conv_buf_00,in_stack_ffffffffffffff14,bit_depth_00,
                    (CompoundParam *)CONCAT44(in_stack_ffffffffffffff0c,uVar2));
  memcpy(local_a8,local_d8,0x30);
  (*local_30)(local_40,local_5c,local_48,0x80,local_5c,local_60,local_68,local_70,in_stack_00000020,
              in_stack_00000028,local_a8,local_74);
  return;
}

Assistant:

void Convolve(highbd_convolve_2d_func test_func, const uint16_t *src1,
                const uint16_t *src2, uint16_t *dst, uint16_t *conv_buf,
                const CompoundParam &compound, const InterpFilter h_f,
                const InterpFilter v_f, const int sub_x, const int sub_y) {
    const BlockSize &block = GetParam().Block();
    const int width = block.Width();
    const int height = block.Height();

    const InterpFilterParams *filter_params_x =
        av1_get_interp_filter_params_with_block_size(h_f, width);
    const InterpFilterParams *filter_params_y =
        av1_get_interp_filter_params_with_block_size(v_f, height);
    const int bit_depth = GetParam().BitDepth();
    ConvolveParams conv_params =
        GetConvolveParams(0, conv_buf, kOutputStride, bit_depth, compound);
    test_func(src1, width, dst, kOutputStride, width, height, filter_params_x,
              filter_params_y, sub_x, sub_y, &conv_params, bit_depth);

    conv_params =
        GetConvolveParams(1, conv_buf, kOutputStride, bit_depth, compound);
    test_func(src2, width, dst, kOutputStride, width, height, filter_params_x,
              filter_params_y, sub_x, sub_y, &conv_params, bit_depth);
  }